

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenAtomicWait(BinaryenModuleRef module,BinaryenExpressionRef ptr,BinaryenExpressionRef expected
                  ,BinaryenExpressionRef timeout,BinaryenType expectedType,char *memoryName)

{
  AtomicWait *this;
  string_view sVar1;
  
  sVar1 = (string_view)getMemoryName(module,memoryName);
  this = (AtomicWait *)MixedArena::allocSpace(&module->allocator,0x48,8);
  *(undefined8 *)&(this->super_SpecificExpression<(wasm::Expression::Id)26>).super_Expression = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)26>).super_Expression.type.id = 0;
  (this->offset).addr = 0;
  this->ptr = (Expression *)0x0;
  this->expected = (Expression *)0x0;
  this->timeout = (Expression *)0x0;
  (this->expectedType).id = 0;
  (this->memory).super_IString.str._M_len = 0;
  (this->memory).super_IString.str._M_str = (char *)0x0;
  (this->super_SpecificExpression<(wasm::Expression::Id)26>).super_Expression._id = AtomicWaitId;
  (this->super_SpecificExpression<(wasm::Expression::Id)26>).super_Expression.type.id = 0;
  (this->offset).addr = 0;
  this->ptr = ptr;
  this->expected = expected;
  this->timeout = timeout;
  (this->expectedType).id = expectedType;
  wasm::AtomicWait::finalize(this);
  (this->memory).super_IString.str = sVar1;
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicWait(BinaryenModuleRef module,
                                         BinaryenExpressionRef ptr,
                                         BinaryenExpressionRef expected,
                                         BinaryenExpressionRef timeout,
                                         BinaryenType expectedType,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicWait((Expression*)ptr,
                      (Expression*)expected,
                      (Expression*)timeout,
                      Type(expectedType),
                      0,
                      getMemoryName(module, memoryName)));
}